

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  bool bVar1;
  reference pcVar2;
  long in_RDI;
  padding_info pVar3;
  padding_info padding;
  const_iterator it;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  user_chars;
  const_iterator end;
  char in_stack_000005ff;
  pattern_formatter *in_stack_00000600;
  padding_info in_stack_00000608;
  undefined7 in_stack_ffffffffffffff18;
  char in_stack_ffffffffffffff1f;
  aggregate_formatter *in_stack_ffffffffffffff20;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  *in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  local_98 [2];
  size_t local_88;
  undefined8 uStack_80;
  size_t local_78;
  undefined8 uStack_70;
  padding_info local_68;
  undefined8 local_58;
  padding_info local_50 [2];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [2];
  undefined8 local_18;
  
  local_18 = std::__cxx11::string::end();
  std::
  unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>>
  ::unique_ptr<std::default_delete<spdlog::details::aggregate_formatter>,void>
            ((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
              *)in_stack_ffffffffffffff20);
  std::
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ::clear((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           *)0x1d4037);
  local_28[0]._M_current = (char *)std::__cxx11::string::begin();
  pVar3.side_ = (int)in_stack_ffffffffffffff40;
  pVar3.truncate_ = (bool)(char)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  pVar3.enabled_ = (bool)(char)((ulong)in_stack_ffffffffffffff40 >> 0x28);
  pVar3._14_2_ = (short)((ulong)in_stack_ffffffffffffff40 >> 0x30);
  pVar3.width_ = in_stack_ffffffffffffff48;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_28);
    if (*pcVar2 == '%') {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                          *)0x1d4090);
      if (bVar1) {
        in_stack_ffffffffffffff50._M_current = (char *)(in_RDI + 0x90);
        std::
        unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
        ::
        unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>,void>
                  ((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                    *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        std::
        vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
        ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                     *)in_stack_ffffffffffffff20,
                    (value_type *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        std::
        unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
        ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                       *)in_stack_ffffffffffffff20);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_28);
      local_58 = local_18;
      pVar3 = handle_padspec_((pattern_formatter *)pVar3.width_,pVar3._8_8_,
                              in_stack_ffffffffffffff50);
      local_50[0].width_ = pVar3.width_;
      local_68.side_ = pVar3.side_;
      local_50[0].side_ = local_68.side_;
      local_68._12_2_ = pVar3._12_2_;
      local_50[0].truncate_ = local_68.truncate_;
      local_50[0].enabled_ = local_68.enabled_;
      local_68 = pVar3;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      if (!bVar1) break;
      bVar1 = details::padding_info::enabled(local_50);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(local_28);
        uStack_70 = CONCAT26(local_50[0]._14_2_,CONCAT24(local_50[0]._12_2_,local_50[0].side_));
        local_78 = local_50[0].width_;
        handle_flag_<spdlog::details::scoped_padder>
                  (in_stack_00000600,in_stack_000005ff,in_stack_00000608);
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(local_28);
        uStack_80 = CONCAT26(local_50[0]._14_2_,CONCAT24(local_50[0]._12_2_,local_50[0].side_));
        local_88 = local_50[0].width_;
        handle_flag_<spdlog::details::null_scoped_padder>
                  (in_stack_00000600,in_stack_000005ff,in_stack_00000608);
      }
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                          *)0x1d425d);
      if (!bVar1) {
        std::make_unique<spdlog::details::aggregate_formatter>();
        std::
        unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
        ::operator=((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                     *)in_stack_ffffffffffffff20,
                    (unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                     *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        std::
        unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
        ::~unique_ptr((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                       *)in_stack_ffffffffffffff20);
      }
      in_stack_ffffffffffffff30 =
           std::
           unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
           ::operator->((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                         *)0x1d4296);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(local_28);
      details::aggregate_formatter::add_ch(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_28);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                      *)0x1d42da);
  if (bVar1) {
    in_stack_ffffffffffffff20 = (aggregate_formatter *)(in_RDI + 0x90);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)in_stack_ffffffffffffff30,local_98);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_stack_ffffffffffffff20,
                (value_type *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                   *)in_stack_ffffffffffffff20);
  }
  std::
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  ::~unique_ptr((unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                 *)in_stack_ffffffffffffff20);
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern)
{
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it)
    {
        if (*it == '%')
        {
            if (user_chars) // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end)
            {
                if (padding.enabled())
                {
                    handle_flag_<details::scoped_padder>(*it, padding);
                }
                else
                {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            }
            else
            {
                break;
            }
        }
        else // chars not following the % sign should be displayed as is
        {
            if (!user_chars)
            {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars) // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}